

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

int Curl_pgrsUpdate(Curl_easy *data)

{
  _Bool _Var1;
  int iVar2;
  curltime now_00;
  curltime cVar3;
  int result_1;
  int result;
  _Bool showprogress;
  curltime now;
  Curl_easy *data_local;
  
  cVar3 = Curl_now();
  now_00._12_4_ = 0;
  now_00.tv_sec = SUB128(cVar3._0_12_,0);
  now_00.tv_usec = SUB124(cVar3._0_12_,8);
  _Var1 = progress_calc(data,now_00);
  if (((data->progress).flags & 0x10U) == 0) {
    if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
      if ((data->set).fprogress != (curl_progress_callback)0x0) {
        Curl_set_in_callback(data,true);
        iVar2 = (*(data->set).fprogress)
                          ((data->set).progress_client,(double)(data->progress).size_dl,
                           (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                           (double)(data->progress).uploaded);
        Curl_set_in_callback(data,false);
        if (iVar2 != 0x10000001) {
          if (iVar2 == 0) {
            return 0;
          }
          Curl_failf(data,"Callback aborted");
          return iVar2;
        }
      }
    }
    else {
      Curl_set_in_callback(data,true);
      iVar2 = (*(data->set).fxferinfo)
                        ((data->set).progress_client,(data->progress).size_dl,
                         (data->progress).downloaded,(data->progress).size_ul,
                         (data->progress).uploaded);
      Curl_set_in_callback(data,false);
      if (iVar2 != 0x10000001) {
        if (iVar2 == 0) {
          return 0;
        }
        Curl_failf(data,"Callback aborted");
        return iVar2;
      }
    }
    if (_Var1) {
      progress_meter(data);
    }
  }
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }
    else if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }

    if(showprogress)
      progress_meter(data);
  }

  return 0;
}